

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-solver-c.cc
# Opt level: O2

void NLW2_DestroyNLSolver_C(NLW2_NLSolver_C *pnls)

{
  NLW2_Solution_C_Data *this;
  NLSolver *this_00;
  
  this = (NLW2_Solution_C_Data *)pnls->p_sol_;
  if (this != (NLW2_Solution_C_Data *)0x0) {
    mp::NLW2_Solution_C_Data::~NLW2_Solution_C_Data(this);
    operator_delete(this,0xa8);
    pnls->p_sol_ = (void *)0x0;
  }
  this_00 = (NLSolver *)pnls->p_nlsol_;
  if (this_00 != (NLSolver *)0x0) {
    mp::NLSolver::~NLSolver(this_00);
  }
  operator_delete(this_00,200);
  pnls->p_nlsol_ = (void *)0x0;
  if ((long *)pnls->p_utl_ != (long *)0x0) {
    (**(code **)(*pnls->p_utl_ + 8))();
    pnls->p_utl_ = (void *)0x0;
  }
  return;
}

Assistant:

void NLW2_DestroyNLSolver_C(NLW2_NLSolver_C* pnls) {
  if (pnls->p_sol_) {
    delete (mp::NLW2_Solution_C_Data*)pnls->p_sol_;
    pnls->p_sol_ = nullptr;
  }
  delete (mp::NLSOL_C_Impl*)(pnls->p_nlsol_);
  pnls->p_nlsol_ = nullptr;
  if (pnls->p_utl_) {
    delete (mp::NLUtils_C_Impl*)(pnls->p_utl_);
    pnls->p_utl_ = nullptr;
  }
}